

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Throw.hpp
# Opt level: O0

bool __thiscall
ut11::Operands::WillThrow<ecs::EntityNotFoundException>::operator()
          (WillThrow<ecs::EntityNotFoundException> *this,function<void_()> *function)

{
  EntityNotFoundException *anon_var_0;
  stringstream stream;
  exception *ex;
  stringstream stream_1;
  function<void_()> *function_local;
  WillThrow<ecs::EntityNotFoundException> *this_local;
  
  std::function<void_()>::operator()(function);
  return false;
}

Assistant:

inline bool operator()(std::function<void (void)> function) const
			{
				try
				{
					function();
				}
				catch(const Exception&)
				{
					return true;
				}
				catch(const std::exception& ex)
				{
					std::stringstream stream;
					stream << "Expected " << m_exceptionName << " to be thrown, but std::exception was thrown instead (what: " << ex.what() << ")";
					m_errorMessage = stream.str();
				}
				catch(...)
				{
					std::stringstream stream;
					stream << "Expected " << m_exceptionName << " to be thrown, but an unknown exception was thrown instead";
					m_errorMessage = stream.str();
				}
				return false;
			}